

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

void __thiscall llvm::yaml::Output::blockScalarString(Output *this,StringRef *S)

{
  uint uVar1;
  raw_ostream *prVar2;
  StringRef Str;
  size_t in_RCX;
  size_t __n;
  int iVar3;
  StringRef InputData;
  StringRef Str_00;
  StringRef Str_01;
  StringRef BufferName;
  undefined1 local_58 [8];
  line_iterator Lines;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> Buffer;
  
  if ((this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
      super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
      super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.Size
      != 0) {
    newLineCheck(this);
  }
  this->Column = this->Column + 2;
  Str_00.Length = 2;
  Str_00.Data = " |";
  raw_ostream::operator<<(this->Out,Str_00);
  prVar2 = this->Out;
  if (prVar2->OutBufEnd == prVar2->OutBufCur) {
    raw_ostream::write(prVar2,0xe5017f,(void *)0x1,in_RCX);
  }
  else {
    *prVar2->OutBufCur = '\n';
    prVar2->OutBufCur = prVar2->OutBufCur + 1;
  }
  this->Column = 0;
  uVar1 = (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
          super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
          super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.
          Size;
  InputData.Length = (size_t)S->Data;
  InputData.Data = (char *)&Lines.CurrentLine.Length;
  BufferName.Length = (size_t)"";
  BufferName.Data = (char *)S->Length;
  MemoryBuffer::getMemBuffer(InputData,BufferName,false);
  __n = 0;
  line_iterator::line_iterator
            ((line_iterator *)local_58,(MemoryBuffer *)Lines.CurrentLine.Length,false,'\0');
  while (iVar3 = uVar1 + (uVar1 == 0), local_58 != (undefined1  [8])0x0) {
    do {
      this->Column = this->Column + 2;
      Str_01.Length = 2;
      Str_01.Data = "  ";
      raw_ostream::operator<<(this->Out,Str_01);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    Str.Length = (size_t)Lines.CurrentLine.Data;
    Str.Data = (char *)Lines._8_8_;
    this->Column = this->Column + (int)Lines.CurrentLine.Data;
    raw_ostream::operator<<(this->Out,Str);
    prVar2 = this->Out;
    if (prVar2->OutBufEnd == prVar2->OutBufCur) {
      raw_ostream::write(prVar2,0xe5017f,(void *)0x1,__n);
    }
    else {
      *prVar2->OutBufCur = '\n';
      prVar2->OutBufCur = prVar2->OutBufCur + 1;
    }
    this->Column = 0;
    line_iterator::advance((line_iterator *)local_58);
  }
  if (Lines.CurrentLine.Length != 0) {
    (**(code **)(*(long *)Lines.CurrentLine.Length + 8))();
  }
  return;
}

Assistant:

void Output::blockScalarString(StringRef &S) {
  if (!StateStack.empty())
    newLineCheck();
  output(" |");
  outputNewLine();

  unsigned Indent = StateStack.empty() ? 1 : StateStack.size();

  auto Buffer = MemoryBuffer::getMemBuffer(S, "", false);
  for (line_iterator Lines(*Buffer, false); !Lines.is_at_end(); ++Lines) {
    for (unsigned I = 0; I < Indent; ++I) {
      output("  ");
    }
    output(*Lines);
    outputNewLine();
  }
}